

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalBlockwiseNLJoin,duckdb::LogicalAnyJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::JoinType&,unsigned_long&>
          (PhysicalPlan *this,LogicalAnyJoin *args,PhysicalOperator *args_1,PhysicalOperator *args_2
          ,unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *args_3,
          JoinType *args_4,unsigned_long *args_5)

{
  pointer *pprVar1;
  iterator __position;
  PhysicalBlockwiseNLJoin *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_48;
  PhysicalOperator *local_40;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  local_40 = args_2;
  this_00 = (PhysicalBlockwiseNLJoin *)ArenaAllocator::AllocateAligned(&this->arena,0x90);
  local_48._M_head_impl =
       (args_3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (args_3->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  PhysicalBlockwiseNLJoin::PhysicalBlockwiseNLJoin
            (this_00,(LogicalOperator *)args,args_1,local_40,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_48,*args_4,*args_5);
  if (local_48._M_head_impl != (Expression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_48._M_head_impl = (Expression *)0x0;
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_38);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return (PhysicalOperator *)this_00;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}